

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall duckdb::RadixHTGlobalSinkState::Destroy(RadixHTGlobalSinkState *this)

{
  bool bVar1;
  reference this_00;
  pointer pAVar2;
  pointer this_01;
  TupleDataLayout *this_02;
  reference this_03;
  type this_04;
  idx_t *piVar3;
  TupleDataChunkState *pTVar4;
  idx_t count;
  pointer this_05;
  unique_lock<std::mutex> guard;
  TupleDataLayout layout;
  TupleDataChunkIterator iterator;
  undefined1 local_328 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_320;
  pointer local_318;
  unique_lock<std::mutex> local_310;
  TupleDataLayout local_300;
  TupleDataChunkIterator local_268;
  
  if (((this->scan_pin_properties != DESTROY_AFTER_DONE) && (this->count_before_combining != 0)) &&
     ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
              ::operator[](&this->partitions,0);
    pAVar2 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
             ::operator->(this_00);
    this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(&pAVar2->data);
    this_02 = TupleDataCollection::GetLayout(this_01);
    TupleDataLayout::Copy(&local_300,this_02);
    if (local_300.aggr_destructor_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_300.aggr_destructor_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_310._M_device = &(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock;
      local_310._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_310);
      local_310._M_owns = true;
      this_03 = vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_true>::back
                          (&this->stored_allocators);
      local_328 = (undefined1  [8])shared_ptr<duckdb::ArenaAllocator,_true>::operator*(this_03);
      local_320._M_head_impl = (Vector *)0x0;
      this_05 = (this->partitions).
                super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_318 = (this->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (this_05 != local_318) {
        do {
          pAVar2 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                   ::operator->(this_05);
          this_04 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                    ::operator*(&pAVar2->data);
          piVar3 = TupleDataCollection::Count(this_04);
          if (*piVar3 != 0) {
            TupleDataChunkIterator::TupleDataChunkIterator
                      (&local_268,this_04,DESTROY_AFTER_DONE,false);
            pTVar4 = TupleDataChunkIterator::GetChunkState(&local_268);
            do {
              count = TupleDataChunkIterator::GetCurrentChunkCount(&local_268);
              RowOperations::DestroyStates
                        ((RowOperationsState *)local_328,&local_300,&pTVar4->row_locations,count);
              bVar1 = TupleDataChunkIterator::Next(&local_268);
            } while (bVar1);
            TupleDataCollection::Reset(this_04);
            TupleDataChunkState::~TupleDataChunkState(&local_268.state.chunk_state);
            std::
            vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
            ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                       *)&local_268.state.pin_state.heap_handles);
            std::
            vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
            ::~vector((vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
                       *)&local_268.state);
          }
          this_05 = this_05 + 1;
        } while (this_05 != local_318);
        if (local_320._M_head_impl != (Vector *)0x0) {
          ::std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_320,local_320._M_head_impl);
        }
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&local_310);
    }
    if (local_300.aggr_destructor_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_300.aggr_destructor_idxs.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_300.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_300.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_300.struct_layouts.
        super_unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
        ._M_t.
        super___uniq_ptr_impl<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>,_true,_true>
         )0x0) {
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TupleDataLayout>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_300.struct_layouts.
                       super_unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                       ._M_t.
                       super___uniq_ptr_impl<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_false>
                       ._M_head_impl);
      operator_delete((void *)local_300.struct_layouts.
                              super_unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                              ._M_t.
                              super___uniq_ptr_impl<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
                              .
                              super__Head_base<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_false>
                              ._M_head_impl);
    }
    local_300.struct_layouts.
    super_unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
    ._M_t.
    super___uniq_ptr_impl<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
    .
    super__Head_base<0UL,_std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>_>
          )(__uniq_ptr_data<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>,_std::default_delete<std::unordered_map<unsigned_long,_duckdb::TupleDataLayout,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TupleDataLayout>_>_>_>,_true,_true>
            )0x0;
    ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::~vector
              (&local_300.aggregates.
                super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_300);
  }
  return;
}

Assistant:

void RadixHTGlobalSinkState::Destroy() {
	if (scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE || count_before_combining == 0 ||
	    partitions.empty()) {
		// Already destroyed / empty
		return;
	}

	TupleDataLayout layout = partitions[0]->data->GetLayout().Copy();
	if (!layout.HasDestructor()) {
		return; // No destructors, exit
	}

	// There are aggregates with destructors: Call the destructor for each of the aggregates
	auto guard = Lock();
	RowOperationsState row_state(*stored_allocators.back());
	for (auto &partition : partitions) {
		auto &data_collection = *partition->data;
		if (data_collection.Count() == 0) {
			continue;
		}
		TupleDataChunkIterator iterator(data_collection, TupleDataPinProperties::DESTROY_AFTER_DONE, false);
		auto &row_locations = iterator.GetChunkState().row_locations;
		do {
			RowOperations::DestroyStates(row_state, layout, row_locations, iterator.GetCurrentChunkCount());
		} while (iterator.Next());
		data_collection.Reset();
	}
}